

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarCommand.cpp
# Opt level: O2

void __thiscall VarCommand::doCommand(VarCommand *this)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__return_storage_ptr__;
  unsigned_long uVar1;
  reference pvVar2;
  undefined1 local_58 [8];
  string name;
  
  uVar1 = DataCommands::getIndex(this->dataCommands);
  __return_storage_ptr__ =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)((long)&name.field_2 + 8);
  DataCommands::getSeparated_abi_cxx11_(__return_storage_ptr__,this->dataCommands);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::at(__return_storage_ptr__,uVar1 + 1);
  std::__cxx11::string::string((string *)local_58,(string *)pvVar2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&name.field_2 + 8));
  DataVars::addNewVar(this->dataVars,(string *)local_58);
  DataCommands::setIndex(this->dataCommands,uVar1 + 1);
  std::__cxx11::string::~string((string *)local_58);
  return;
}

Assistant:

void VarCommand::doCommand() {
    // get the index from dataCommands
    unsigned long index = this->dataCommands->getIndex();
    // skip the command
    index++;
    // get the name from the vector in dataCommands
    string name = this->dataCommands->getSeparated().at(index);
    // else, we add the new var to the map in dataVars
    this->dataVars->addNewVar(name);
    // set the new index of dataCommands
    this->dataCommands->setIndex(index);
}